

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-opcodecnt.cc
# Opt level: O2

int ProgramMain(int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  Result RVar2;
  char *pcVar3;
  size_t sVar4;
  _Base_ptr p_Var5;
  Callback *callback;
  char *pcVar6;
  uint uVar7;
  long lVar8;
  string_view filename;
  string_view filename_00;
  allocator local_109;
  OpcodeInfoCounts counts;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  FileStream stream;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            ((OptionParser *)&stream,"wasm-opcodecnt",
             "  Read a file in the wasm binary format, and count opcode usage for\n  instructions.\n\nexamples:\n  # parse binary file test.wasm and write pcode dist file test.dist\n  $ wasm-opcodecnt test.wasm -o test.dist\n"
            );
  counts._M_t._M_impl._0_8_ = 0;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc:58:72)>
       ::_M_invoke;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc:58:72)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)&stream,'v',"verbose","Use multiple times for more info",
             (NullCallback *)&counts);
  if (counts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    (*(code *)counts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)(&counts,&counts,3);
  }
  wabt::Features::AddOptions(&s_features,(OptionParser *)&stream);
  counts._M_t._M_impl._0_8_ = 0;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc:66:20)>
       ::_M_invoke;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc:66:20)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)&stream,'o',"output","FILENAME",
             "Output file for the opcode counts, by default use stdout",(Callback *)&counts);
  if (counts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    (*(code *)counts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)(&counts,&counts,3);
  }
  counts._M_t._M_impl._0_8_ = 0;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc:69:7)>
       ::_M_invoke;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc:69:7)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)&stream,'c',"cutoff","N","Cutoff for reporting counts less than N",
             (Callback *)&counts);
  if (counts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    (*(code *)counts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)(&counts,&counts,3);
  }
  counts._M_t._M_impl._0_8_ = 0;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc:73:7)>
       ::_M_invoke;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc:73:7)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)&stream,'s',"separator","SEPARATOR",
             "Separator text between element and count when reporting counts",(Callback *)&counts);
  if (counts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    (*(code *)counts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)(&counts,&counts,3);
  }
  std::__cxx11::string::string((string *)&counts,"filename",&local_109);
  callback = (Callback *)&file_data;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc:75:22)>
                ::_M_manager;
  uVar7 = 1;
  wabt::OptionParser::AddArgument((OptionParser *)&stream,(string *)&counts,OneOrMore,callback);
  if (file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(&file_data,&file_data,3);
  }
  std::__cxx11::string::_M_dispose();
  wabt::OptionParser::Parse((OptionParser *)&stream,argc,argv);
  wabt::OptionParser::~OptionParser((OptionParser *)&stream);
  pcVar6 = s_infile;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar3 = (char *)strlen(s_infile);
  filename.size_ = (size_type)&file_data;
  filename.data_ = pcVar3;
  RVar2 = wabt::ReadFile((wabt *)pcVar6,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
  pcVar6 = s_outfile;
  if (RVar2.enum_ == Error) {
    pcVar6 = "stdin";
    if (s_infile != (char *)0x0) {
      pcVar6 = s_infile;
    }
    fprintf(_stderr,"%s:%d: Unable to parse: %s",
            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc"
            ,0x9f,pcVar6);
    uVar7 = 1;
  }
  else {
    if (s_outfile == (char *)0x0) {
      wabt::FileStream::FileStream(&stream,_stdout,(Stream *)0x0);
    }
    else {
      sVar4 = strlen(s_outfile);
      filename_00.size_ = sVar4;
      filename_00.data_ = pcVar6;
      wabt::FileStream::FileStream(&stream,filename_00,(Stream *)0x0);
    }
    if (RVar2.enum_ == Ok) {
      p_Var1 = &counts._M_t._M_impl.super__Rb_tree_header;
      counts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           counts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      counts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      counts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      s_read_binary_options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
      s_read_binary_options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
      s_read_binary_options.features.sat_float_to_int_enabled_ =
           s_features.sat_float_to_int_enabled_;
      s_read_binary_options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
      s_read_binary_options.features.simd_enabled_ = s_features.simd_enabled_;
      s_read_binary_options.features.threads_enabled_ = s_features.threads_enabled_;
      s_read_binary_options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
      s_read_binary_options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
      s_read_binary_options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
      s_read_binary_options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
      s_read_binary_options.features.annotations_enabled_ = s_features.annotations_enabled_;
      s_read_binary_options.features.gc_enabled_ = s_features.gc_enabled_;
      s_read_binary_options.features.memory64_enabled_ = s_features.memory64_enabled_;
      counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      counts._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      RVar2 = wabt::ReadBinaryOpcnt
                        (file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (long)file_data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)file_data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,&s_read_binary_options,
                         &counts);
      if (RVar2.enum_ == Ok) {
        lVar8 = 0;
        for (p_Var5 = counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var5 != p_Var1; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)
            ) {
          lVar8 = lVar8 + *(long *)(p_Var5 + 2);
        }
        wabt::Stream::Writef(&stream.super_Stream,"Total opcodes: %zd\n\n",lVar8);
        wabt::Stream::Writef(&stream.super_Stream,"Opcode counts:\n");
        WriteCounts(&stream.super_Stream,&counts);
        wabt::Stream::Writef(&stream.super_Stream,"\nOpcode counts with immediates:\n");
        WriteCountsWithImmediates(&stream.super_Stream,&counts);
      }
      std::
      _Rb_tree<wabt::OpcodeInfo,_std::pair<const_wabt::OpcodeInfo,_unsigned_long>,_std::_Select1st<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>,_std::less<wabt::OpcodeInfo>,_std::allocator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>_>
      ::~_Rb_tree(&counts._M_t);
      uVar7 = (uint)(RVar2.enum_ != Ok);
    }
    wabt::FileStream::~FileStream(&stream);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return uVar7;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  Result result = ReadFile(s_infile, &file_data);
  if (Failed(result)) {
    const char* input_name = s_infile ? s_infile : "stdin";
    ERROR("Unable to parse: %s", input_name);
    return 1;
  }

  FileStream stream(s_outfile ? FileStream(s_outfile) : FileStream(stdout));

  if (Succeeded(result)) {
    OpcodeInfoCounts counts;
    s_read_binary_options.features = s_features;
    result = ReadBinaryOpcnt(file_data.data(), file_data.size(),
                             s_read_binary_options, &counts);
    if (Succeeded(result)) {
      stream.Writef("Total opcodes: %" PRIzd "\n\n", SumCounts(counts));

      stream.Writef("Opcode counts:\n");
      WriteCounts(stream, counts);

      stream.Writef("\nOpcode counts with immediates:\n");
      WriteCountsWithImmediates(stream, counts);
    }
  }

  return result != Result::Ok;
}